

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O2

REF_STATUS ref_part_metric(REF_NODE ref_node,char *filename)

{
  double *pdVar1;
  undefined8 *puVar2;
  REF_MPI pRVar3;
  REF_DBL *pRVar4;
  REF_INT RVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  REF_STATUS RVar9;
  size_t sVar10;
  FILE *pFVar11;
  void *data;
  long lVar12;
  REF_DBL RVar13;
  FILE *pFVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  REF_DBL RVar20;
  uint uVar21;
  FILE *pFVar22;
  char *pcVar23;
  char *pcVar24;
  int iVar25;
  bool bVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  ulong uStackY_650;
  REF_INT version;
  FILE *local_630;
  FILE *local_628;
  REF_INT dim;
  REF_INT ldim;
  REF_INT type;
  undefined4 uStack_614;
  REF_INT dim_1;
  REF_INT ntype;
  undefined4 uStack_604;
  REF_BOOL csv_format;
  REF_BOOL solb_format;
  long local_5f8;
  ulong local_5f0;
  REF_DBL local_5e8;
  ulong local_5e0;
  REF_DBL local_5d8;
  REF_INT type_1;
  REF_INT ntype_1;
  uint local_5c8;
  undefined4 uStack_5c4;
  undefined4 uStack_5c0;
  undefined4 uStack_5bc;
  REF_INT nnode;
  undefined4 uStack_5b4;
  undefined8 local_5b0;
  undefined8 local_5a8;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined8 local_590;
  REF_INT local;
  double local_580;
  double dStack_578;
  double local_570;
  undefined8 uStack_568;
  double local_560;
  double local_558;
  double local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined4 local_528;
  undefined4 uStack_524;
  undefined4 uStack_520;
  undefined4 uStack_51c;
  char line [1024];
  
  solb_format = 0;
  csv_format = 0;
  dim = -1;
  pRVar3 = ref_node->ref_mpi;
  if (pRVar3->id == 0) {
    sVar10 = strlen(filename);
    iVar6 = strcmp(filename + (sVar10 - 5),".solb");
    if (iVar6 == 0) {
      solb_format = 1;
    }
  }
  uVar7 = ref_mpi_all_or(pRVar3,&solb_format);
  if (uVar7 != 0) {
    uStackY_650 = (ulong)uVar7;
    pcVar23 = "bcast";
    uVar19 = 0x82b;
    goto LAB_001305fd;
  }
  pRVar3 = ref_node->ref_mpi;
  if (solb_format == 0) {
    if (pRVar3->id == 0) {
      sVar10 = strlen(filename);
      iVar6 = strcmp(filename + (sVar10 - 4),".csv");
      if (iVar6 == 0) {
        csv_format = 1;
      }
    }
    uVar7 = ref_mpi_all_or(pRVar3,&csv_format);
    if (uVar7 != 0) {
      uStackY_650 = (ulong)uVar7;
      pcVar23 = "bcast";
      uVar19 = 0x837;
      goto LAB_001305fd;
    }
    pFVar11 = (FILE *)ref_node->ref_mpi;
    if (csv_format == 0) {
      local_5e0 = CONCAT44(local_5e0._4_4_,1);
      if (*(int *)&pFVar11->field_0x4 == 0) {
        pFVar11 = fopen(filename,"r");
        if (pFVar11 == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          pcVar23 = "unable to open file";
          uVar19 = 0x843;
          goto LAB_00131098;
        }
        sVar10 = strlen(filename);
        iVar6 = strcmp(filename + (sVar10 - 4),".sol");
        if (iVar6 == 0) {
          dim = -1;
          do {
            iVar6 = feof(pFVar11);
            if (iVar6 != 0) {
LAB_00131167:
              if (dim == -1) goto LAB_00132304;
              pcVar23 = "SolAtVertices keyword missing from .sol metric";
              uVar19 = 0x872;
              goto LAB_00132325;
            }
            iVar6 = __isoc99_fscanf(pFVar11,"%s",line);
            if (iVar6 != 1) {
              if (iVar6 == -1) goto LAB_00131167;
              lVar16 = (long)iVar6;
              pcVar23 = "line read failed";
              lVar12 = 1;
              uVar19 = 0x84d;
              goto LAB_001324af;
            }
            iVar6 = bcmp("Dimension",line,10);
            if ((iVar6 == 0) && (iVar6 = __isoc99_fscanf(pFVar11,"%d",&dim), iVar6 != 1)) {
              lVar16 = (long)iVar6;
              pcVar23 = "read dim";
              lVar12 = 1;
              uVar19 = 0x850;
              goto LAB_001324af;
            }
            iVar6 = bcmp("SolAtVertices",line,0xe);
          } while (iVar6 != 0);
          iVar6 = __isoc99_fscanf(pFVar11,"%d",&nnode);
          if (iVar6 != 1) {
            lVar16 = (long)iVar6;
            pcVar23 = "read nnode";
            lVar12 = 1;
            uVar19 = 0x854;
            goto LAB_001324af;
          }
          lVar12 = ref_node->old_n_global;
          lVar16 = (long)nnode;
          if (lVar12 != lVar16) {
            pcVar23 = "wrong vertex number in .sol";
            uVar19 = 0x856;
            goto LAB_001324af;
          }
          iVar6 = __isoc99_fscanf(pFVar11,"%d",&ntype);
          if (iVar6 != 1) {
            lVar16 = (long)iVar6;
            pcVar23 = "read number of types";
            lVar12 = 1;
            uVar19 = 0x857;
            goto LAB_001324af;
          }
          iVar6 = 0;
          for (iVar25 = 0; iVar25 < ntype; iVar25 = iVar25 + 1) {
            iVar8 = __isoc99_fscanf(pFVar11,"%d",&type);
            if (iVar8 != 1) {
              lVar16 = (long)iVar8;
              pcVar23 = "read number of types";
              lVar12 = 1;
              uVar19 = 0x85a;
              goto LAB_001324af;
            }
            if (2 < type - 1U) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x85d,"ref_part_metric","only types 1 (scalar) or 3 (tensor)) supported");
              printf(" %d type\n",(ulong)(uint)type);
              return 1;
            }
            if (type == 3) {
              if (dim == 2) {
                iVar6 = iVar6 + 3;
              }
              else {
                iVar6 = iVar6 + 6;
              }
            }
            else {
              iVar6 = iVar6 + (uint)(type == 1);
            }
          }
          if (dim == 2) {
            if (iVar6 != 3) {
              lVar16 = (long)iVar6;
              pcVar23 = "2D expects 3 terms of 2x2 metric";
              lVar12 = 3;
              uVar19 = 0x868;
              goto LAB_001324af;
            }
          }
          else if (iVar6 != 6) {
            lVar16 = (long)iVar6;
            pcVar23 = "3D expects 6 terms of 3x3 metric";
            lVar12 = 6;
            uVar19 = 0x86a;
            goto LAB_001324af;
          }
          iVar6 = __isoc99_fscanf(pFVar11,"%*[^1234567890-+.]");
          if (iVar6 < 0) {
            pcVar23 = "skip blank line";
            uVar19 = 0x86c;
LAB_00132325:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar19,"ref_part_metric",pcVar23);
            return 1;
          }
          if (dim == -1) {
LAB_00132304:
            pcVar23 = "Dimension keyword missing from .sol metric";
            uVar19 = 0x871;
            goto LAB_00132325;
          }
          local_5e0 = local_5e0 & 0xffffffff00000000;
        }
        else {
          _nnode = (REF_DBL)CONCAT44(uStack_5b4,(int)ref_node->old_n_global);
        }
      }
      else {
        pFVar11 = (FILE *)0x0;
      }
      uVar7 = ref_mpi_bcast(ref_node->ref_mpi,&nnode,1,1);
      if (uVar7 == 0) {
        RVar13 = (REF_DBL)(long)nnode;
        uVar7 = nnode / ref_node->ref_mpi->n;
        RVar20 = 4.94065645841247e-319;
        if (100000 < (int)uVar7) {
          RVar20 = (REF_DBL)(ulong)uVar7;
        }
        if ((long)RVar13 <= (long)RVar20) {
          RVar20 = RVar13;
        }
        if ((long)RVar13 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x87d,"ref_part_metric","malloc metric of REF_DBL negative");
          return 1;
        }
        uVar7 = SUB84(RVar20,0) * 6;
        local_630 = (FILE *)malloc((ulong)uVar7 << 3);
        if (local_630 != (FILE *)0x0) {
          lVar12 = 0;
          uVar15 = 0;
          if (0 < (int)uVar7) {
            uVar15 = (ulong)uVar7;
          }
          for (; uVar15 * 8 != lVar12; lVar12 = lVar12 + 8) {
            *(undefined8 *)((long)&local_630->_flags + lVar12) = 0xbff0000000000000;
          }
          local_5c8 = 0;
          uStack_5c4 = 0;
          uStack_5c0 = 0;
          uStack_5bc = 0x3ff00000;
          uVar21 = 0;
          local_5f0 = CONCAT44(local_5f0._4_4_,uVar7);
          lVar12 = 0;
          local_628 = pFVar11;
          local_5e8 = RVar20;
          while (uVar15 = local_5e0, pFVar11 = local_628, lVar12 < SUB84(RVar13,0)) {
            local_5d8 = (REF_DBL)(ref_node->old_n_global - lVar12);
            if ((long)local_5e8 < (long)local_5d8) {
              local_5d8 = local_5e8;
            }
            local_5f8 = lVar12;
            if (ref_node->ref_mpi->id == 0) {
              uVar18 = 0;
              if (0 < SUB84(local_5d8,0)) {
                uVar18 = (ulong)local_5d8 & 0xffffffff;
              }
              for (lVar12 = 0; uVar18 * 0x30 - lVar12 != 0; lVar12 = lVar12 + 0x30) {
                pcVar23 = local_630->_shortbuf + lVar12 + -0x7b;
                pcVar24 = local_630->_shortbuf + lVar12 + -0x6b;
                lVar16 = (long)&local_630->_flags + lVar12;
                if ((char)uVar15 == '\0') {
                  if (dim == 3) {
                    iVar6 = __isoc99_fscanf(local_628,"%lf %lf %lf %lf %lf %lf",lVar16,pcVar23,
                                            pcVar24,local_630->_shortbuf + lVar12 + -0x73,
                                            local_630->_shortbuf + lVar12 + -99,
                                            local_630->_shortbuf + lVar12 + -0x5b);
                    if (iVar6 != 6) {
                      lVar16 = (long)iVar6;
                      pcVar23 = "metric read error";
                      lVar12 = 6;
                      uVar19 = 0x88d;
                      goto LAB_001324af;
                    }
                  }
                  else {
                    iVar6 = __isoc99_fscanf(local_628,"%lf %lf %lf",lVar16,pcVar23,pcVar24);
                    if (iVar6 != 3) {
                      lVar16 = (long)iVar6;
                      pcVar23 = "metric read error";
                      lVar12 = 3;
                      uVar19 = 0x892;
                      goto LAB_001324af;
                    }
                    *(undefined8 *)(local_630->_shortbuf + lVar12 + -0x73) = 0;
                    *(ulong *)(local_630->_shortbuf + lVar12 + -99) = CONCAT44(uStack_5c4,local_5c8)
                    ;
                    *(ulong *)(local_630->_shortbuf + lVar12 + -99 + 8) =
                         CONCAT44(uStack_5bc,uStack_5c0);
                  }
                }
                else {
                  iVar6 = __isoc99_fscanf(local_628,"%lf %lf %lf %lf %lf %lf",lVar16,pcVar23,
                                          local_630->_shortbuf + lVar12 + -0x73,pcVar24,
                                          local_630->_shortbuf + lVar12 + -99,
                                          local_630->_shortbuf + lVar12 + -0x5b);
                  if (iVar6 != 6) {
                    lVar16 = (long)iVar6;
                    pcVar23 = "metric read error";
                    lVar12 = 6;
                    uVar19 = 0x89d;
                    goto LAB_001324af;
                  }
                }
              }
              uVar7 = ref_mpi_bcast(ref_node->ref_mpi,local_630,(uint)local_5f0,3);
              lVar12 = local_5f8;
              pFVar11 = local_630;
              if (uVar7 != 0) {
                pcVar23 = "bcast";
                uVar19 = 0x8a1;
                goto LAB_001311bb;
              }
            }
            else {
              uVar7 = ref_mpi_bcast(ref_node->ref_mpi,local_630,uVar7,3);
              if (uVar7 != 0) {
                pcVar23 = "bcast";
                uVar19 = 0x8a5;
LAB_001311bb:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,uVar19,"ref_part_metric",(ulong)uVar7,pcVar23);
                return uVar7;
              }
              uVar18 = 0;
              lVar12 = local_5f8;
              pFVar11 = local_630;
              if (0 < SUB84(local_5d8,0)) {
                uVar18 = (ulong)local_5d8 & 0xffffffff;
              }
            }
            while (bVar26 = uVar18 != 0, uVar18 = uVar18 - 1, bVar26) {
              uVar7 = ref_node_local(ref_node,lVar12,&local);
              if ((uVar7 != 0) && (uVar7 != 5)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x8a9,"ref_part_metric",(ulong)uVar7,"local");
                uVar21 = uVar7;
              }
              if ((uVar7 != 5) && (uVar7 != 0)) {
                return uVar21;
              }
              if ((local != -1) &&
                 (uVar7 = ref_node_metric_set(ref_node,local,(REF_DBL *)pFVar11), uVar7 != 0)) {
                pcVar23 = "set local node met";
                uVar19 = 0x8ac;
                goto LAB_001311bb;
              }
              lVar12 = lVar12 + 1;
              pFVar11 = (FILE *)&pFVar11->_IO_write_end;
            }
            RVar13 = (REF_DBL)((ulong)_nnode & 0xffffffff);
            uVar7 = (uint)local_5f0;
            lVar12 = local_5f8 + local_5d8._0_4_;
          }
          free(local_630);
          if (ref_node->ref_mpi->id != 0) {
            return 0;
          }
          iVar6 = fclose(pFVar11);
          if (iVar6 == 0) {
            return 0;
          }
          lVar16 = (long)iVar6;
          pcVar23 = "close file";
          uVar19 = 0x8b3;
          lVar12 = 0;
LAB_001324af:
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar19,"ref_part_metric",pcVar23,lVar12,lVar16);
          return 1;
        }
        pcVar23 = "malloc metric of REF_DBL NULL";
        uVar19 = 0x87d;
LAB_00131098:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar19,"ref_part_metric",pcVar23);
        return 2;
      }
      uStackY_650 = (ulong)uVar7;
      pcVar23 = "bcast nnode";
      uVar19 = 0x878;
      goto LAB_001305fd;
    }
    if (*(int *)&pFVar11->field_0x4 == 0) {
      local_628 = pFVar11;
      pFVar11 = fopen(filename,"r");
      if (pFVar11 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar23 = "unable to open file";
        uVar19 = 0x7b1;
        goto LAB_001308e5;
      }
      pcVar23 = fgets(line,0x400,pFVar11);
      if (line == pcVar23) {
        puts(line);
        version = 0;
        while (pcVar23 = fgets(line,0x400,pFVar11), line == pcVar23) {
          pcVar23 = strtok(line,",");
          iVar6 = 0xc;
          while (pcVar23 != (char *)0x0) {
            pcVar23 = strtok((char *)0x0,",");
            iVar6 = iVar6 + -1;
          }
          if (iVar6 == 0) {
            version = version + 1;
          }
        }
        printf("nline %d \n");
        RVar5 = version;
        uVar15 = (ulong)(uint)version;
        if (-1 < version) {
          pFVar14 = (FILE *)malloc(uVar15 * 0x18);
          if (pFVar14 == (FILE *)0x0) {
            pcVar23 = "malloc xyz of REF_DBL NULL";
            uVar19 = 0x7bf;
          }
          else {
            for (lVar12 = 0; uVar15 * 3 != lVar12; lVar12 = lVar12 + 1) {
              *(undefined8 *)(&pFVar14->_flags + lVar12 * 2) = 0;
            }
            local_630 = pFVar14;
            data = malloc((ulong)(uint)(RVar5 * 6) * 8);
            if (data != (void *)0x0) {
              for (uVar15 = 0; (uint)(RVar5 * 6) != uVar15; uVar15 = uVar15 + 1) {
                *(undefined8 *)((long)data + uVar15 * 8) = 0;
              }
              iVar6 = fseek(pFVar11,0,0);
              if (iVar6 == 0) {
                pcVar23 = fgets(line,0x400,pFVar11);
                if (line == pcVar23) {
                  version = 0;
                  while (pcVar23 = fgets(line,0x400,pFVar11), line == pcVar23) {
                    pcVar23 = strtok(line,",");
                    lVar12 = 0;
                    while (pcVar23 != (char *)0x0) {
                      if (lVar12 == 0xc) {
                        pcVar23 = "too many col";
                        uVar19 = 0x7c8;
                        goto LAB_00130701;
                      }
                      dVar29 = atof(pcVar23);
                      *(double *)(&local + lVar12 * 2) = dVar29;
                      lVar12 = lVar12 + 1;
                      pcVar23 = strtok((char *)0x0,",");
                    }
                    if (lVar12 == 0xc) {
                      lVar12 = (long)version;
                      *(size_t *)((long)data + lVar12 * 0x30) = _local;
                      pdVar1 = (double *)((long)data + (long)(version * 6 + 1) * 8);
                      *pdVar1 = (local_570 + local_580) * 0.5;
                      pdVar1[1] = (local_558 + dStack_578) * 0.5;
                      *(undefined8 *)((long)data + lVar12 * 0x30 + 0x18) = uStack_568;
                      *(double *)((long)data + lVar12 * 0x30 + 0x20) = (local_560 + local_550) * 0.5
                      ;
                      *(undefined8 *)((long)data + lVar12 * 0x30 + 0x28) = local_548;
                      *(undefined8 *)(&local_630->_flags + lVar12 * 6) = local_540;
                      *(undefined8 *)(&local_630->_flags + lVar12 * 6 + 2) = uStack_538;
                      *(undefined8 *)(local_630->_shortbuf + lVar12 * 0x18 + -0x73) = local_530;
                      version = version + 1;
                    }
                  }
                  fclose(pFVar11);
                  pFVar11 = local_628;
                  goto LAB_001304b8;
                }
                pcVar23 = "read header";
                uVar19 = 0x7c2;
              }
              else {
                pcVar23 = "rewind";
                uVar19 = 0x7c1;
              }
              goto LAB_00130701;
            }
            pcVar23 = "malloc metric of REF_DBL NULL";
            uVar19 = 0x7c0;
          }
LAB_001308e5:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar19,"ref_part_metric_csv",pcVar23);
          uStackY_650 = 2;
          goto LAB_00131b9c;
        }
        pcVar23 = "malloc xyz of REF_DBL negative";
        uVar19 = 0x7bf;
      }
      else {
        pcVar23 = "read header";
        uVar19 = 0x7b2;
      }
LAB_00130701:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar19
             ,"ref_part_metric_csv",pcVar23);
      uStackY_650 = 1;
    }
    else {
      data = (void *)0x0;
      local_630 = (FILE *)0x0;
LAB_001304b8:
      uStackY_650 = 1;
      uVar7 = ref_mpi_bcast((REF_MPI)pFVar11,&version,1,1);
      if (uVar7 == 0) {
        uVar15 = (ulong)(uint)version;
        if (*(int *)&pFVar11->field_0x4 == 0) {
          uVar18 = (ulong)(uint)(version * 3);
LAB_0013098a:
          pFVar14 = local_630;
          uVar7 = ref_mpi_bcast((REF_MPI)pFVar11,local_630,(REF_INT)uVar18,3);
          if (uVar7 == 0) {
            uVar7 = ref_mpi_bcast((REF_MPI)pFVar11,data,version * 6,3);
            if (uVar7 == 0) {
              uVar7 = ref_search_create((REF_SEARCH *)&ntype,version);
              if (uVar7 == 0) {
                uVar7 = ref_list_create((REF_LIST *)&type);
                if (uVar7 == 0) {
                  lVar12 = 0;
                  pFVar11 = pFVar14;
                  do {
                    if (version <= lVar12) {
                      lVar12 = 0;
                      goto LAB_00131ce9;
                    }
                    uVar7 = ref_search_insert((REF_SEARCH)CONCAT44(uStack_604,ntype),(REF_INT)lVar12
                                              ,(REF_DBL *)pFVar11,0.0);
                    lVar12 = lVar12 + 1;
                    pFVar11 = (FILE *)&pFVar11->_IO_read_base;
                  } while (uVar7 == 0);
                  uStackY_650 = (ulong)uVar7;
                  pcVar23 = "ins";
                  uVar19 = 0x7ee;
                }
                else {
                  uStackY_650 = (ulong)uVar7;
                  pcVar23 = "touching list";
                  uVar19 = 0x7eb;
                }
              }
              else {
                uStackY_650 = (ulong)uVar7;
                pcVar23 = "create search";
                uVar19 = 0x7ea;
              }
            }
            else {
              uStackY_650 = (ulong)uVar7;
              pcVar23 = "bcast metric";
              uVar19 = 0x7e2;
            }
          }
          else {
            uStackY_650 = (ulong)uVar7;
            pcVar23 = "bcast xyz";
            uVar19 = 0x7e1;
          }
          goto LAB_00131b92;
        }
        if (-1 < version) {
          uVar18 = uVar15 * 3;
          pFVar14 = (FILE *)malloc(uVar15 * 0x18);
          if (pFVar14 == (FILE *)0x0) {
            pcVar23 = "malloc xyz of REF_DBL NULL";
            uVar19 = 0x7de;
          }
          else {
            for (uVar17 = 0; uVar18 != uVar17; uVar17 = uVar17 + 1) {
              *(undefined8 *)(&pFVar14->_flags + uVar17 * 2) = 0;
            }
            local_630 = pFVar14;
            data = malloc(uVar15 * 0x30);
            if (data != (void *)0x0) {
              for (lVar12 = 0; uVar15 * 6 - lVar12 != 0; lVar12 = lVar12 + 1) {
                *(undefined8 *)((long)data + lVar12 * 8) = 0;
              }
              goto LAB_0013098a;
            }
            pcVar23 = "malloc metric of REF_DBL NULL";
            uVar19 = 0x7df;
          }
          goto LAB_001308e5;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x7de,"ref_part_metric_csv","malloc xyz of REF_DBL negative");
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x7dc,"ref_part_metric_csv",(ulong)uVar7,"bcast line");
        uStackY_650 = (ulong)uVar7;
      }
    }
LAB_00131b9c:
    pcVar23 = "part metric .csv";
    uVar19 = 0x83a;
    goto LAB_001305fd;
  }
  _local = 0xffffffffffffffff;
  if (pRVar3->id != 0) {
    pFVar11 = (FILE *)0x0;
    goto LAB_00130357;
  }
  uVar7 = ref_import_meshb_header(filename,&version,(REF_FILEPOS *)line);
  if (uVar7 != 0) {
    uStackY_650 = (ulong)uVar7;
    pcVar23 = "header";
    uVar19 = 0x722;
    goto LAB_001305d2;
  }
  uStackY_650 = 1;
  if (version - 2U < 3) {
    pFVar11 = fopen(filename,"r");
    if (pFVar11 == (FILE *)0x0) {
      uStackY_650 = 2;
      printf("unable to open %s\n",filename);
      pcVar23 = "unable to open file";
      uVar19 = 0x726;
      goto LAB_00130836;
    }
    uVar7 = ref_import_meshb_jump
                      ((FILE *)pFVar11,version,(REF_FILEPOS *)line,3,&type,(REF_FILEPOS *)&local);
    if (uVar7 == 0) {
      if (type == 0) {
        pcVar23 = "solb missing dimension";
        uVar19 = 0x72a;
      }
      else {
        sVar10 = fread(&dim_1,4,1,pFVar11);
        if (sVar10 != 1) {
          pcVar23 = "dim";
          uStackY_650 = 1;
          uVar19 = 0x72b;
          goto LAB_001310cf;
        }
        if ((dim_1 & 0xfffffffeU) == 2) {
          uVar7 = ref_import_meshb_jump
                            ((FILE *)pFVar11,version,(REF_FILEPOS *)line,0x3e,&type,
                             (REF_FILEPOS *)&local);
          if (uVar7 != 0) {
            pcVar23 = "jump";
            uVar19 = 0x72f;
            goto LAB_0013079f;
          }
          if (type != 0) {
            RVar9 = ref_part_meshb_long((FILE *)pFVar11,version,(REF_LONG *)&nnode);
            if (RVar9 != 0) {
              pcVar23 = "nnode";
              uStackY_650 = 1;
              uVar19 = 0x731;
              goto LAB_001305d2;
            }
            sVar10 = fread(&ntype_1,4,1,pFVar11);
            if (sVar10 == 1) {
              ldim = 0;
              iVar6 = 0;
              if (0 < ntype_1) {
                iVar6 = ntype_1;
              }
              while (iVar6 != 0) {
                local_630 = (FILE *)CONCAT44(local_630._4_4_,iVar6 + -1);
                sVar10 = fread(&type_1,4,1,pFVar11);
                if (sVar10 != 1) {
                  pcVar23 = "type";
                  uStackY_650 = 1;
                  uVar19 = 0x735;
                  goto LAB_001310cf;
                }
                if (2 < type_1 - 1U) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x738,"ref_part_metric_solb",
                         "only types 1 (scalar) or 3 (tensor)) supported");
                  printf(" %d type\n",(ulong)(uint)type_1);
                  goto LAB_001305dc;
                }
                iVar6 = (int)local_630;
                if (type_1 == 3) {
                  if (dim_1 == 2) {
                    ldim = ldim + 3;
                  }
                  else {
                    ldim = ldim + 6;
                  }
                }
                else if (type_1 == 1) {
                  ldim = ldim + 1;
                }
              }
              sVar10 = (size_t)ldim;
              if (dim_1 == 2) {
                if (ldim == 3) {
LAB_00130357:
                  uVar7 = ref_mpi_bcast(ref_node->ref_mpi,&version,1,1);
                  if (uVar7 == 0) {
                    uVar7 = ref_mpi_bcast(ref_node->ref_mpi,&dim_1,1,1);
                    if (uVar7 == 0) {
                      uVar7 = ref_mpi_bcast(ref_node->ref_mpi,&nnode,1,2);
                      if (uVar7 == 0) {
                        uStackY_650 = 1;
                        uVar7 = ref_mpi_bcast(ref_node->ref_mpi,&ldim,1,2);
                        RVar20 = _nnode;
                        if (uVar7 != 0) {
                          pcVar23 = "bcast ldim";
                          uVar19 = 0x74f;
                          goto LAB_0013079f;
                        }
                        RVar13 = (REF_DBL)ref_node->old_n_global;
                        if ((_nnode == RVar13) || ((REF_DBL)((long)_nnode / 2) == RVar13)) {
                          lVar12 = (long)_nnode / (long)ref_node->ref_mpi->n;
                          RVar13 = (REF_DBL)(long)(int)lVar12;
                          if (lVar12 < 100000) {
                            RVar13 = 4.94065645841247e-319;
                          }
                          if ((long)_nnode <= (long)RVar13) {
                            RVar13 = _nnode;
                          }
                          if (-1 < SUB84(RVar13,0)) {
                            uVar21 = SUB84(RVar13,0) * 6;
                            local_5d8 = RVar13;
                            pFVar14 = (FILE *)malloc((ulong)uVar21 << 3);
                            if (pFVar14 == (FILE *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0x75d,"ref_part_metric_solb","malloc metric of REF_DBL NULL");
                              uStackY_650 = 2;
                              goto LAB_001305dc;
                            }
                            uVar15 = 0;
                            uVar18 = 0;
                            if (0 < (int)uVar21) {
                              uVar18 = (ulong)uVar21;
                            }
                            for (; uVar18 != uVar15; uVar15 = uVar15 + 1) {
                              *(undefined8 *)(&pFVar14->_flags + uVar15 * 2) = 0xbff0000000000000;
                            }
                            local_528 = 0;
                            uStack_524 = 0;
                            uStack_520 = 0;
                            uStack_51c = 0x3ff00000;
                            local_5c8 = 0;
                            local_5f8 = CONCAT44(local_5f8._4_4_,uVar21);
                            RVar13 = 0.0;
                            local_628 = pFVar14;
                            while ((long)RVar13 < (long)RVar20) {
                              uVar7 = SUB84(RVar20,0) - SUB84(RVar13,0);
                              local_5f0 = (ulong)uVar7;
                              if (SUB84(local_5d8,0) < (int)uVar7) {
                                local_5f0 = (ulong)local_5d8 & 0xffffffff;
                              }
                              local_5e8 = RVar13;
                              if (ref_node->ref_mpi->id == 0) {
                                local_5e0 = 0;
                                if (0 < (int)local_5f0) {
                                  local_5e0 = local_5f0;
                                }
                                local_630 = (FILE *)(local_5e0 * 0x30);
                                pFVar14 = local_628;
                                for (pFVar22 = (FILE *)0x0; local_630 != pFVar22;
                                    pFVar22 = (FILE *)&pFVar22->_IO_write_end) {
                                  if (ldim == 3) {
                                    sVar10 = fread((void *)((long)&pFVar22->_flags +
                                                           (long)&pFVar14->_flags),8,1,pFVar11);
                                    if (sVar10 != 1) {
                                      pcVar23 = "m11";
                                      uStackY_650 = 1;
                                      uVar19 = 0x774;
                                      goto LAB_001310cf;
                                    }
                                    sVar10 = fread(pFVar22->_shortbuf +
                                                   (long)((long)&pFVar14[-1]._IO_save_end + 5),8,1,
                                                   pFVar11);
                                    if (sVar10 != 1) {
                                      pcVar23 = "m12";
                                      uStackY_650 = 1;
                                      uVar19 = 0x776;
                                      goto LAB_001310cf;
                                    }
                                    sVar10 = fread(pFVar22->_shortbuf +
                                                   (long)((long)&pFVar14[-1]._chain + 5),8,1,pFVar11
                                                  );
                                    if (sVar10 != 1) {
                                      pcVar23 = "m22";
                                      uStackY_650 = 1;
                                      uVar19 = 0x778;
                                      goto LAB_001310cf;
                                    }
                                    *(undefined8 *)((long)&pFVar14->_IO_read_end + (long)pFVar22) =
                                         0;
                                    puVar2 = (undefined8 *)
                                             ((long)&pFVar14->_IO_write_base + (long)pFVar22);
                                    *puVar2 = CONCAT44(uStack_524,local_528);
                                    puVar2[1] = CONCAT44(uStack_51c,uStack_520);
                                  }
                                  else {
                                    if (ldim != 6) {
                                      pcVar23 = "not a 2D or 3D ldim";
                                      uVar19 = 0x77d;
                                      goto LAB_00130836;
                                    }
                                    sVar10 = fread((void *)((long)&pFVar22->_flags +
                                                           (long)&pFVar14->_flags),8,1,pFVar11);
                                    if (sVar10 != 1) {
                                      pcVar23 = "m11";
                                      uStackY_650 = 1;
                                      uVar19 = 0x766;
                                      goto LAB_001310cf;
                                    }
                                    sVar10 = fread(pFVar22->_shortbuf +
                                                   (long)((long)&local_628[-1]._IO_save_end + 5),8,1
                                                   ,pFVar11);
                                    if (sVar10 != 1) {
                                      pcVar23 = "m12";
                                      uStackY_650 = 1;
                                      uVar19 = 0x768;
                                      goto LAB_001310cf;
                                    }
                                    sVar10 = fread(pFVar22->_shortbuf +
                                                   (long)((long)&local_628[-1]._chain + 5),8,1,
                                                   pFVar11);
                                    if (sVar10 != 1) {
                                      pcVar23 = "m22";
                                      uStackY_650 = 1;
                                      uVar19 = 0x76b;
                                      goto LAB_001310cf;
                                    }
                                    sVar10 = fread(pFVar22->_shortbuf +
                                                   (long)((long)&local_628[-1]._markers + 5),8,1,
                                                   pFVar11);
                                    if (sVar10 != 1) {
                                      pcVar23 = "m31";
                                      uStackY_650 = 1;
                                      uVar19 = 0x76d;
                                      goto LAB_001310cf;
                                    }
                                    sVar10 = fread(pFVar22->_shortbuf +
                                                   (long)((long)&local_628[-1]._flags2 + 1),8,1,
                                                   pFVar11);
                                    if (sVar10 != 1) {
                                      pcVar23 = "m32";
                                      uStackY_650 = 1;
                                      uVar19 = 0x76f;
                                      goto LAB_001310cf;
                                    }
                                    sVar10 = fread(pFVar22->_shortbuf +
                                                   (long)((long)&local_628[-1]._old_offset + 5),8,1,
                                                   pFVar11);
                                    pFVar14 = local_628;
                                    if (sVar10 != 1) {
                                      pcVar23 = "m33";
                                      uStackY_650 = 1;
                                      uVar19 = 0x771;
                                      goto LAB_001310cf;
                                    }
                                  }
                                }
                                uVar21 = (uint)local_5f8;
                                uVar7 = ref_mpi_bcast(ref_node->ref_mpi,local_628,(uint)local_5f8,3)
                                ;
                                if (uVar7 != 0) {
                                  pcVar23 = "bcast";
                                  uVar19 = 0x782;
                                  goto LAB_0013079f;
                                }
                              }
                              else {
                                uVar7 = ref_mpi_bcast(ref_node->ref_mpi,local_628,uVar21,3);
                                if (uVar7 != 0) {
                                  pcVar23 = "bcast";
                                  uVar19 = 0x786;
                                  goto LAB_0013079f;
                                }
                                local_5e0 = 0;
                                if (0 < (int)local_5f0) {
                                  local_5e0 = local_5f0 & 0xffffffff;
                                }
                              }
                              local_630 = local_628;
                              RVar20 = local_5e8;
                              while (bVar26 = local_5e0 != 0, local_5e0 = local_5e0 - 1, bVar26) {
                                uVar7 = ref_node_local(ref_node,(REF_GLOB)RVar20,&ntype);
                                if ((uVar7 != 0) && (uVar7 != 5)) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                         ,0x78a,"ref_part_metric_solb",(ulong)uVar7,"local");
                                  local_5c8 = uVar7;
                                }
                                if ((uVar7 != 5) && (uVar7 != 0)) {
LAB_0013190c:
                                  uStackY_650 = (ulong)local_5c8;
                                  if (local_5c8 == 0) {
                                    return 0;
                                  }
                                  goto LAB_001305dc;
                                }
                                if ((ntype != -1) &&
                                   (uVar7 = ref_node_metric_set(ref_node,ntype,(REF_DBL *)local_630)
                                   , uVar7 != 0)) {
                                  uVar19 = 0x78d;
LAB_00131c0d:
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                         ,uVar19,"ref_part_metric_solb",(ulong)uVar7,
                                         "set local node met");
                                  uStackY_650 = (ulong)uVar7;
                                  goto LAB_001305dc;
                                }
                                if (dim_1 == 2) {
                                  uVar7 = ref_node_local(ref_node,(long)_nnode + (long)RVar20,&ntype
                                                        );
                                  if ((uVar7 != 0) && (uVar7 != 5)) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0x791,"ref_part_metric_solb",(ulong)uVar7,"local");
                                    local_5c8 = uVar7;
                                  }
                                  if ((uVar7 != 5) && (uVar7 != 0)) goto LAB_0013190c;
                                  if ((ntype != -1) &&
                                     (uVar7 = ref_node_metric_set(ref_node,ntype,
                                                                  (REF_DBL *)local_630), uVar7 != 0)
                                     ) {
                                    uVar19 = 0x794;
                                    goto LAB_00131c0d;
                                  }
                                }
                                local_630 = (FILE *)&local_630->_IO_write_end;
                                RVar20 = (REF_DBL)((long)RVar20 + 1);
                                uVar21 = (uint)local_5f8;
                              }
                              RVar20 = _nnode;
                              RVar13 = (REF_DBL)((long)local_5e8 + (long)(int)(uint)local_5f0);
                            }
                            free(local_628);
                            uStackY_650 = _local;
                            if (pRVar3->id != 0) {
                              return 0;
                            }
                            sVar10 = ftello(pFVar11);
                            if (uStackY_650 == sVar10) {
                              iVar6 = fclose(pFVar11);
                              if (iVar6 == 0) {
                                return 0;
                              }
                              sVar10 = (size_t)iVar6;
                              pcVar23 = "close file";
                              uVar19 = 0x79e;
                              uStackY_650 = 0;
                            }
                            else {
                              pcVar23 = "end location";
                              uVar19 = 0x79d;
                            }
                            goto LAB_001310cf;
                          }
                          pcVar23 = "malloc metric of REF_DBL negative";
                          uVar19 = 0x75d;
                        }
                        else {
                          if (pRVar3->id == 0) {
                            printf("file %ld ref_node %ld %s\n",_nnode,RVar13,filename);
                          }
                          pcVar23 = "global count mismatch";
                          uVar19 = 0x756;
                        }
                        goto LAB_00130836;
                      }
                      uStackY_650 = (ulong)uVar7;
                      pcVar23 = "bcast nnode";
                      uVar19 = 0x74d;
                    }
                    else {
                      uStackY_650 = (ulong)uVar7;
                      pcVar23 = "bcast dim";
                      uVar19 = 0x74b;
                    }
                  }
                  else {
                    uStackY_650 = (ulong)uVar7;
                    pcVar23 = "bcast version";
                    uVar19 = 0x749;
                  }
LAB_001305d2:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,uVar19,"ref_part_metric_solb",uStackY_650,pcVar23);
                  goto LAB_001305dc;
                }
                pcVar23 = "2D expects 3 terms of 2x2 metric";
                uStackY_650 = 3;
                uVar19 = 0x743;
              }
              else {
                if (ldim == 6) goto LAB_00130357;
                pcVar23 = "3D expects 6 terms of 3x3 metric";
                uStackY_650 = 6;
                uVar19 = 0x745;
              }
            }
            else {
              pcVar23 = "ntype";
              uStackY_650 = 1;
              uVar19 = 0x732;
            }
LAB_001310cf:
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar19,"ref_part_metric_solb",pcVar23,uStackY_650,sVar10);
            uStackY_650 = 1;
            goto LAB_001305dc;
          }
          pcVar23 = "SolAtVertices missing";
          uVar19 = 0x730;
        }
        else {
          pcVar23 = "unsupported dimension";
          uVar19 = 0x72c;
        }
      }
      goto LAB_00130836;
    }
    pcVar23 = "jump";
    uVar19 = 0x729;
LAB_0013079f:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar19,
           "ref_part_metric_solb",(ulong)uVar7,pcVar23);
    uStackY_650 = (ulong)uVar7;
  }
  else {
    pcVar23 = "unsupported version";
    uVar19 = 0x723;
LAB_00130836:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar19,
           "ref_part_metric_solb",pcVar23);
  }
LAB_001305dc:
  pcVar23 = "part metric .solb";
  uVar19 = 0x82e;
LAB_001305fd:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar19,
         "ref_part_metric",uStackY_650,pcVar23);
  return (REF_STATUS)uStackY_650;
LAB_00131ce9:
  if (ref_node->max <= lVar12) goto LAB_0013217c;
  if (-1 < ref_node->global[lVar12]) {
    uVar7 = ref_search_touching((REF_SEARCH)CONCAT44(uStack_604,ntype),
                                (REF_LIST)CONCAT44(uStack_614,type),ref_node->real + lVar12 * 0xf,
                                1.0);
    if (uVar7 != 0) {
      uStackY_650 = (ulong)uVar7;
      pcVar23 = "search tree";
      uVar19 = 0x7f4;
      goto LAB_00131b92;
    }
    uVar7 = *(uint *)CONCAT44(uStack_614,type);
    uVar15 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar15 = 0;
    }
    uVar27 = 0xd7d7625a;
    uVar28 = 0x6974e718;
    iVar6 = -1;
    for (uVar18 = 0; uVar15 != uVar18; uVar18 = uVar18 + 1) {
      iVar25 = *(int *)(*(long *)((uint *)CONCAT44(uStack_614,type) + 2) + uVar18 * 4);
      pRVar4 = ref_node->real;
      dVar29 = pRVar4[lVar12 * 0xf + 1] -
               *(double *)(pFVar14->_shortbuf + (long)(iVar25 * 3) * 8 + -0x7b);
      dVar30 = pRVar4[lVar12 * 0xf] - *(double *)(&pFVar14->_flags + (long)iVar25 * 6);
      dVar31 = pRVar4[lVar12 * 0xf + 2] -
               *(double *)(pFVar14->_shortbuf + (long)(iVar25 * 3) * 8 + -0x73);
      dVar29 = SQRT(dVar31 * dVar31 + dVar29 * dVar29 + dVar30 * dVar30);
      if (dVar29 <= (double)CONCAT44(uVar28,uVar27) && (double)CONCAT44(uVar28,uVar27) != dVar29) {
        iVar6 = iVar25;
      }
      if ((double)CONCAT44(uVar28,uVar27) <= dVar29) {
        dVar29 = (double)CONCAT44(uVar28,uVar27);
      }
      uVar27 = SUB84(dVar29,0);
      uVar28 = (undefined4)((ulong)dVar29 >> 0x20);
    }
    if (iVar6 == -1) {
      pcVar23 = "best not found";
      uVar19 = 0x802;
      goto LAB_00130701;
    }
    lVar16 = (long)(iVar6 * 6);
    _nnode = *(REF_DBL *)((long)data + lVar16 * 8);
    local_5b0 = *(undefined8 *)((long)data + (long)(iVar6 * 6 + 1) * 8);
    local_5a8 = *(undefined8 *)((long)data + lVar16 * 8 + 0x10);
    local_5a0 = *(undefined8 *)((long)data + lVar16 * 8 + 0x18);
    local_598 = *(undefined8 *)((long)data + lVar16 * 8 + 0x20);
    local_590 = *(undefined8 *)((long)data + lVar16 * 8 + 0x28);
    uVar7 = ref_node_metric_set(ref_node,(REF_INT)lVar12,(REF_DBL *)&nnode);
    if (uVar7 != 0) {
      uStackY_650 = (ulong)uVar7;
      pcVar23 = "set local node met";
      uVar19 = 0x809;
      goto LAB_00131b92;
    }
    uVar7 = ref_list_erase((REF_LIST)CONCAT44(uStack_614,type));
    if (uVar7 != 0) {
      uStackY_650 = (ulong)uVar7;
      pcVar23 = "erase";
      uVar19 = 0x80a;
      goto LAB_00131b92;
    }
  }
  lVar12 = lVar12 + 1;
  goto LAB_00131ce9;
LAB_0013217c:
  uVar7 = ref_list_free((REF_LIST)CONCAT44(uStack_614,type));
  if (uVar7 == 0) {
    uVar7 = ref_search_free((REF_SEARCH)CONCAT44(uStack_604,ntype));
    if (uVar7 == 0) {
      free(pFVar14);
      free(data);
      return 0;
    }
    uStackY_650 = (ulong)uVar7;
    pcVar23 = "free search";
    uVar19 = 0x80d;
  }
  else {
    uStackY_650 = (ulong)uVar7;
    pcVar23 = "free list";
    uVar19 = 0x80c;
  }
LAB_00131b92:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar19,
         "ref_part_metric_csv",uStackY_650,pcVar23);
  goto LAB_00131b9c;
}

Assistant:

REF_FCN REF_STATUS ref_part_metric(REF_NODE ref_node, const char *filename) {
  FILE *file;
  REF_INT chunk;
  REF_DBL *metric;
  REF_INT section_size;
  REF_GLOB nnode_read, global;
  REF_INT node, local;
  size_t end_of_string;
  REF_BOOL sol_format, found_keyword;
  REF_INT nnode, ntype, type;
  REF_INT ldim, i;
  REF_INT status;
  char line[1024];
  REF_BOOL solb_format = REF_FALSE;
  REF_BOOL csv_format = REF_FALSE;
  REF_INT dim = REF_EMPTY;

  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    end_of_string = strlen(filename);
    if (strcmp(&filename[end_of_string - 5], ".solb") == 0)
      solb_format = REF_TRUE;
  }
  RSS(ref_mpi_all_or(ref_node_mpi(ref_node), &solb_format), "bcast");

  if (solb_format) {
    RSS(ref_part_metric_solb(ref_node, filename), "part metric .solb");
    return REF_SUCCESS;
  }

  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    end_of_string = strlen(filename);
    if (strcmp(&filename[end_of_string - 4], ".csv") == 0)
      csv_format = REF_TRUE;
  }
  RSS(ref_mpi_all_or(ref_node_mpi(ref_node), &csv_format), "bcast");

  if (csv_format) {
    RSS(ref_part_metric_csv(ref_node, filename), "part metric .csv");
    return REF_SUCCESS;
  }

  file = NULL;
  sol_format = REF_FALSE;
  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    end_of_string = strlen(filename);
    if (strcmp(&filename[end_of_string - 4], ".sol") == 0) {
      sol_format = REF_TRUE;
      found_keyword = REF_FALSE;
      dim = REF_EMPTY;
      while (!feof(file)) {
        status = fscanf(file, "%s", line);
        if (EOF == status) break;
        REIS(1, status, "line read failed");

        if (0 == strcmp("Dimension", line)) {
          REIS(1, fscanf(file, "%d", &dim), "read dim");
        }

        if (0 == strcmp("SolAtVertices", line)) {
          REIS(1, fscanf(file, "%d", &nnode), "read nnode");
          REIS(ref_node_n_global(ref_node), nnode,
               "wrong vertex number in .sol");
          REIS(1, fscanf(file, "%d", &ntype), "read number of types");
          ldim = 0;
          for (i = 0; i < ntype; i++) {
            REIS(1, fscanf(file, "%d", &type), "read number of types");
            RAB(1 <= type && type <= 3,
                "only types 1 (scalar) or 3 (tensor)) supported",
                { printf(" %d type\n", type); });
            if (1 == type) ldim += 1;
            if (3 == type) {
              if (2 == dim) {
                ldim += 3;
              } else {
                ldim += 6;
              }
            }
          }
          if (2 == dim) {
            REIS(3, ldim, "2D expects 3 terms of 2x2 metric");
          } else {
            REIS(6, ldim, "3D expects 6 terms of 3x3 metric");
          }
          RAS(0 <= fscanf(file, "%*[^1234567890-+.]"), "skip blank line");
          found_keyword = REF_TRUE;
          break;
        }
      }
      RUS(REF_EMPTY, dim, "Dimension keyword missing from .sol metric");
      RAS(found_keyword, "SolAtVertices keyword missing from .sol metric");
    } else {
      nnode = (REF_INT)ref_node_n_global(ref_node);
    }
  }
  RSS(ref_mpi_bcast(ref_node_mpi(ref_node), &nnode, 1, REF_INT_TYPE),
      "bcast nnode");

  chunk = (REF_INT)MAX(100000, nnode / ref_mpi_n(ref_node_mpi(ref_node)));
  chunk = (REF_INT)MIN((REF_GLOB)chunk, nnode);

  ref_malloc_init(metric, 6 * chunk, REF_DBL, -1.0);

  nnode_read = 0;
  while (nnode_read < nnode) {
    section_size =
        (REF_INT)MIN((REF_GLOB)chunk, ref_node_n_global(ref_node) - nnode_read);
    if (ref_mpi_once(ref_node_mpi(ref_node))) {
      for (node = 0; node < section_size; node++)
        if (sol_format) {
          if (3 == dim) {
            REIS(6,
                 fscanf(file, "%lf %lf %lf %lf %lf %lf",
                        &(metric[0 + 6 * node]), &(metric[1 + 6 * node]),
                        &(metric[3 + 6 * node]), /* transposed 3,2 */
                        &(metric[2 + 6 * node]), &(metric[4 + 6 * node]),
                        &(metric[5 + 6 * node])),
                 "metric read error");
          } else {
            REIS(3,
                 fscanf(file, "%lf %lf %lf", &(metric[0 + 6 * node]),
                        &(metric[1 + 6 * node]), &(metric[3 + 6 * node])),
                 "metric read error");
            metric[2 + 6 * node] = 0.0; /* m13 */
            metric[4 + 6 * node] = 0.0; /* m23 */
            metric[5 + 6 * node] = 1.0; /* m33 */
          }
        } else {
          REIS(6,
               fscanf(file, "%lf %lf %lf %lf %lf %lf", &(metric[0 + 6 * node]),
                      &(metric[1 + 6 * node]), &(metric[2 + 6 * node]),
                      &(metric[3 + 6 * node]), &(metric[4 + 6 * node]),
                      &(metric[5 + 6 * node])),
               "metric read error");
        }
      RSS(ref_mpi_bcast(ref_node_mpi(ref_node), metric, 6 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    } else {
      RSS(ref_mpi_bcast(ref_node_mpi(ref_node), metric, 6 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    }
    for (node = 0; node < section_size; node++) {
      global = node + nnode_read;
      RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
      if (REF_EMPTY != local) {
        RSS(ref_node_metric_set(ref_node, local, &(metric[6 * node])),
            "set local node met");
      }
    }
    nnode_read += section_size;
  }

  ref_free(metric);
  if (ref_mpi_once(ref_node_mpi(ref_node))) REIS(0, fclose(file), "close file");

  return REF_SUCCESS;
}